

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edithdu.c
# Opt level: O1

int ffdhdu(fitsfile *fptr,int *hdutype,int *status)

{
  FITSfile *pFVar1;
  LONGLONG *pLVar2;
  int iVar3;
  long lVar4;
  int tmptype;
  long naxes [1];
  
  tmptype = 0;
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar1 = fptr->Fptr;
  lVar4 = (long)pFVar1->curhdu;
  if (lVar4 == 0) {
    pFVar1->headend = 0;
    pFVar1->nextkey = 0;
    ffphpr(fptr,1,8,0,naxes,0,1,1,status);
    lVar4 = fptr->Fptr->headstart[(long)fptr->Fptr->curhdu + 1];
    if ((0x167f < lVar4) && (iVar3 = ffdblk(fptr,(lVar4 + -0xb40) / 0xb40,status), 0 < iVar3))
    goto LAB_0012e0cb;
    fptr->Fptr->datastart = -1;
    ffrdef(fptr,status);
  }
  else {
    iVar3 = ffdblk(fptr,(pFVar1->headstart[lVar4 + 1] - pFVar1->headstart[lVar4]) / 0xb40,status);
    if (0 < iVar3) goto LAB_0012e0cb;
    pFVar1 = fptr->Fptr;
    lVar4 = (long)pFVar1->curhdu;
    iVar3 = pFVar1->maxhdu;
    if (pFVar1->curhdu < iVar3) {
      pLVar2 = pFVar1->headstart;
      do {
        pLVar2[lVar4 + 1] = pLVar2[lVar4 + 2];
        lVar4 = lVar4 + 1;
      } while (lVar4 < iVar3);
    }
    pFVar1->headstart[(long)iVar3 + 1] = 0;
    pFVar1->maxhdu = iVar3 + -1;
    iVar3 = ffrhdu(fptr,&tmptype,status);
    if (0 < iVar3) {
      *status = 0;
      ffcmsg();
      ffgext(fptr,fptr->Fptr->curhdu + -1,&tmptype,status);
    }
  }
  if (hdutype != (int *)0x0) {
    *hdutype = tmptype;
  }
LAB_0012e0cb:
  return *status;
}

Assistant:

int ffdhdu(fitsfile *fptr,      /* I - FITS file pointer                   */
           int *hdutype,        /* O - type of the new CHDU after deletion */
           int *status)         /* IO - error status                       */
/*
  Delete the CHDU.  If the CHDU is the primary array, then replace the HDU
  with an empty primary array with no data.   Return the
  type of the new CHDU after the old CHDU is deleted.
*/
{
    int tmptype = 0;
    long nblocks, ii, naxes[1];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ((fptr->Fptr)->curhdu == 0) /* replace primary array with null image */
    {
        /* ignore any existing keywords */
        (fptr->Fptr)->headend = 0;
        (fptr->Fptr)->nextkey = 0;

        /* write default primary array header */
        ffphpr(fptr,1,8,0,naxes,0,1,1,status);

        /* calc number of blocks to delete (leave just 1 block) */
        nblocks = (long) (( (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1] - 
                2880 ) / 2880);

        /* ffdblk also updates the starting address of all following HDUs */
        if (nblocks > 0)
        {
            if (ffdblk(fptr, nblocks, status) > 0) /* delete the HDU */
                return(*status);
        }

        /* this might not be necessary, but is doesn't hurt */
        (fptr->Fptr)->datastart = DATA_UNDEFINED;

        ffrdef(fptr, status);  /* reinitialize the primary array */
    }
    else
    {

        /* calc number of blocks to delete */
        nblocks = (long) (( (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu + 1] - 
                (fptr->Fptr)->headstart[(fptr->Fptr)->curhdu] ) / 2880);

        /* ffdblk also updates the starting address of all following HDUs */
        if (ffdblk(fptr, nblocks, status) > 0) /* delete the HDU */
            return(*status);

        /* delete the CHDU from the list of HDUs */
        for (ii = (fptr->Fptr)->curhdu + 1; ii <= (fptr->Fptr)->maxhdu; ii++)
            (fptr->Fptr)->headstart[ii] = (fptr->Fptr)->headstart[ii + 1];

        (fptr->Fptr)->headstart[(fptr->Fptr)->maxhdu + 1] = 0;
        ((fptr->Fptr)->maxhdu)--; /* decrement the known number of HDUs */

        if (ffrhdu(fptr, &tmptype, status) > 0)  /* initialize next HDU */
        {
            /* failed (end of file?), so move back one HDU */
            *status = 0;
            ffcmsg();       /* clear extraneous error messages */
            ffgext(fptr, ((fptr->Fptr)->curhdu) - 1, &tmptype, status);
        }
    }

    if (hdutype)
       *hdutype = tmptype;

    return(*status);
}